

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O2

void __thiscall
Lib::DArray<Lib::ArrayMapEntry<Kernel::TermList>_>::DArray
          (DArray<Lib::ArrayMapEntry<Kernel::TermList>_> *this,size_t size)

{
  void *placement;
  ArrayMapEntry<Kernel::TermList> *pAVar1;
  
  this->_size = size;
  this->_capacity = size;
  if (size == 0) {
    pAVar1 = (ArrayMapEntry<Kernel::TermList> *)0x0;
  }
  else {
    placement = Lib::alloc(size << 4);
    pAVar1 = array_new<Lib::ArrayMapEntry<Kernel::TermList>>(placement,this->_capacity);
  }
  this->_array = pAVar1;
  return;
}

Assistant:

inline
  DArray (size_t size=0)
    : _size(size), _capacity(size)
  {
    if(size>0) {
      void* mem = ALLOC_KNOWN(sizeof(C)*_capacity,"DArray<>");
      _array = array_new<C>(mem, _capacity);
    } else {
      _array=0;
    }
  }